

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_copyout_range_all_but_first_and_last_char_Test::TestBody
          (Buffer_copyout_range_all_but_first_and_last_char_Test *this)

{
  bool bVar1;
  size_type sVar2;
  pointer pvVar3;
  char *pcVar4;
  AssertHelper local_1d0;
  Message local_1c8;
  int local_1c0 [2];
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_1;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  size_t local_178;
  size_t len;
  size_type end;
  unsigned_long uStack_160;
  int begin;
  size_type n_wanted;
  array<char,_128UL> array;
  undefined1 local_d0 [8];
  BufferWithReadonlyStrings local;
  Buffer_copyout_range_all_but_first_and_last_char_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  array._M_elems[0x68] = '\0';
  array._M_elems[0x69] = '\0';
  array._M_elems[0x6a] = '\0';
  array._M_elems[0x6b] = '\0';
  array._M_elems[0x6c] = '\0';
  array._M_elems[0x6d] = '\0';
  array._M_elems[0x6e] = '\0';
  array._M_elems[0x6f] = '\0';
  array._M_elems[0x70] = '\0';
  array._M_elems[0x71] = '\0';
  array._M_elems[0x72] = '\0';
  array._M_elems[0x73] = '\0';
  array._M_elems[0x74] = '\0';
  array._M_elems[0x75] = '\0';
  array._M_elems[0x76] = '\0';
  array._M_elems[0x77] = '\0';
  array._M_elems[0x58] = '\0';
  array._M_elems[0x59] = '\0';
  array._M_elems[0x5a] = '\0';
  array._M_elems[0x5b] = '\0';
  array._M_elems[0x5c] = '\0';
  array._M_elems[0x5d] = '\0';
  array._M_elems[0x5e] = '\0';
  array._M_elems[0x5f] = '\0';
  array._M_elems[0x60] = '\0';
  array._M_elems[0x61] = '\0';
  array._M_elems[0x62] = '\0';
  array._M_elems[99] = '\0';
  array._M_elems[100] = '\0';
  array._M_elems[0x65] = '\0';
  array._M_elems[0x66] = '\0';
  array._M_elems[0x67] = '\0';
  array._M_elems[0x48] = '\0';
  array._M_elems[0x49] = '\0';
  array._M_elems[0x4a] = '\0';
  array._M_elems[0x4b] = '\0';
  array._M_elems[0x4c] = '\0';
  array._M_elems[0x4d] = '\0';
  array._M_elems[0x4e] = '\0';
  array._M_elems[0x4f] = '\0';
  array._M_elems[0x50] = '\0';
  array._M_elems[0x51] = '\0';
  array._M_elems[0x52] = '\0';
  array._M_elems[0x53] = '\0';
  array._M_elems[0x54] = '\0';
  array._M_elems[0x55] = '\0';
  array._M_elems[0x56] = '\0';
  array._M_elems[0x57] = '\0';
  array._M_elems[0x38] = '\0';
  array._M_elems[0x39] = '\0';
  array._M_elems[0x3a] = '\0';
  array._M_elems[0x3b] = '\0';
  array._M_elems[0x3c] = '\0';
  array._M_elems[0x3d] = '\0';
  array._M_elems[0x3e] = '\0';
  array._M_elems[0x3f] = '\0';
  array._M_elems[0x40] = '\0';
  array._M_elems[0x41] = '\0';
  array._M_elems[0x42] = '\0';
  array._M_elems[0x43] = '\0';
  array._M_elems[0x44] = '\0';
  array._M_elems[0x45] = '\0';
  array._M_elems[0x46] = '\0';
  array._M_elems[0x47] = '\0';
  array._M_elems[0x28] = '\0';
  array._M_elems[0x29] = '\0';
  array._M_elems[0x2a] = '\0';
  array._M_elems[0x2b] = '\0';
  array._M_elems[0x2c] = '\0';
  array._M_elems[0x2d] = '\0';
  array._M_elems[0x2e] = '\0';
  array._M_elems[0x2f] = '\0';
  array._M_elems[0x30] = '\0';
  array._M_elems[0x31] = '\0';
  array._M_elems[0x32] = '\0';
  array._M_elems[0x33] = '\0';
  array._M_elems[0x34] = '\0';
  array._M_elems[0x35] = '\0';
  array._M_elems[0x36] = '\0';
  array._M_elems[0x37] = '\0';
  array._M_elems[0x18] = '\0';
  array._M_elems[0x19] = '\0';
  array._M_elems[0x1a] = '\0';
  array._M_elems[0x1b] = '\0';
  array._M_elems[0x1c] = '\0';
  array._M_elems[0x1d] = '\0';
  array._M_elems[0x1e] = '\0';
  array._M_elems[0x1f] = '\0';
  array._M_elems[0x20] = '\0';
  array._M_elems[0x21] = '\0';
  array._M_elems[0x22] = '\0';
  array._M_elems[0x23] = '\0';
  array._M_elems[0x24] = '\0';
  array._M_elems[0x25] = '\0';
  array._M_elems[0x26] = '\0';
  array._M_elems[0x27] = '\0';
  array._M_elems[8] = '\0';
  array._M_elems[9] = '\0';
  array._M_elems[10] = '\0';
  array._M_elems[0xb] = '\0';
  array._M_elems[0xc] = '\0';
  array._M_elems[0xd] = '\0';
  array._M_elems[0xe] = '\0';
  array._M_elems[0xf] = '\0';
  array._M_elems[0x10] = '\0';
  array._M_elems[0x11] = '\0';
  array._M_elems[0x12] = '\0';
  array._M_elems[0x13] = '\0';
  array._M_elems[0x14] = '\0';
  array._M_elems[0x15] = '\0';
  array._M_elems[0x16] = '\0';
  array._M_elems[0x17] = '\0';
  n_wanted = 0;
  array._M_elems[0] = '\0';
  array._M_elems[1] = '\0';
  array._M_elems[2] = '\0';
  array._M_elems[3] = '\0';
  array._M_elems[4] = '\0';
  array._M_elems[5] = '\0';
  array._M_elems[6] = '\0';
  array._M_elems[7] = '\0';
  sVar2 = std::size<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local.buf.changed_coalescing);
  uStack_160 = sVar2 - 2;
  end._4_4_ = 1;
  len = sVar2 - 1;
  pvVar3 = std::data<std::array<char,128ul>>((array<char,_128UL> *)&n_wanted);
  local_178 = bfy_buffer_copyout_range((bfy_buffer *)local_d0,1,sVar2 - 1,pvVar3);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_198,"len","n_wanted",&local_178,&stack0xfffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x35e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1c0[1] = 0;
  pcVar4 = std::data<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local.buf.changed_coalescing);
  pvVar3 = std::data<std::array<char,128ul>>((array<char,_128UL> *)&n_wanted);
  local_1c0[0] = memcmp(pcVar4 + 1,pvVar3,local_178);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1b8,"0","memcmp(std::data(local.allstrs)+1, std::data(array), len)",
             local_1c0 + 1,local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x35f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  return;
}

Assistant:

TEST(Buffer, copyout_range_all_but_first_and_last_char) {
    auto local = BufferWithReadonlyStrings {};
    auto array = std::array<char, 128>{};
    auto const n_wanted = std::size(local.allstrs) - 2;
    auto const begin = 1;
    auto const end = begin + n_wanted;
    auto const len = bfy_buffer_copyout_range(&local.buf, begin, end, std::data(array));
    EXPECT_EQ(len, n_wanted);
    EXPECT_EQ(0, memcmp(std::data(local.allstrs)+1, std::data(array), len));
}